

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::ConstructComment_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmCustomCommandGenerator *ccg,
          char *default_comment)

{
  bool bVar1;
  char *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  string *psVar4;
  allocator<char> local_a9;
  string local_a8;
  string *local_88;
  string *o;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string currentBinaryDir;
  char *sep;
  allocator<char> local_29;
  char *local_28;
  char *default_comment_local;
  cmCustomCommandGenerator *ccg_local;
  cmLocalGenerator *this_local;
  string *comment;
  
  local_28 = default_comment;
  default_comment_local = (char *)ccg;
  ccg_local = (cmCustomCommandGenerator *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  pcVar2 = cmCustomCommandGenerator::GetComment(ccg);
  if (pcVar2 == (char *)0x0) {
    pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                       ((cmCustomCommandGenerator *)default_comment_local);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(pvVar3);
    pcVar2 = local_28;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar2,&local_a9);
      std::allocator<char>::~allocator(&local_a9);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Generating ");
      currentBinaryDir.field_2._8_8_ = (long)"PK\x01\x02" + 4;
      psVar4 = GetCurrentBinaryDirectory_abi_cxx11_(this);
      std::__cxx11::string::string((string *)&__range2,(string *)psVar4);
      pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                         ((cmCustomCommandGenerator *)default_comment_local);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar3);
      o = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(pvVar3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&o), bVar1) {
        local_88 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,(char *)currentBinaryDir.field_2._8_8_);
        MaybeConvertToRelativePath(&local_a8,this,(string *)&__range2,local_88);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        currentBinaryDir.field_2._8_8_ = (long)"GLOBAL, DIRECTORY, TARGET, SOURCE, " + 0x21;
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::__cxx11::string::~string((string *)&__range2);
    }
  }
  else {
    pcVar2 = cmCustomCommandGenerator::GetComment((cmCustomCommandGenerator *)default_comment_local)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar2,&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::ConstructComment(
  cmCustomCommandGenerator const& ccg, const char* default_comment)
{
  // Check for a comment provided with the command.
  if (ccg.GetComment()) {
    return ccg.GetComment();
  }

  // Construct a reasonable default comment if possible.
  if (!ccg.GetOutputs().empty()) {
    std::string comment;
    comment = "Generating ";
    const char* sep = "";
    std::string currentBinaryDir = this->GetCurrentBinaryDirectory();
    for (std::string const& o : ccg.GetOutputs()) {
      comment += sep;
      comment += this->MaybeConvertToRelativePath(currentBinaryDir, o);
      sep = ", ";
    }
    return comment;
  }

  // Otherwise use the provided default.
  return default_comment;
}